

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O2

NeuralNetwork *
addInnerProductLayer
          (Model *m,bool isUpdatable,char *name,TensorAttributes *inTensorAttr,
          TensorAttributes *outTensorAttr,bool areWeightsQuantized,bool isBiasQuantized)

{
  NeuralNetwork *pNVar1;
  NeuralNetworkLayer *this;
  InnerProductLayerParams *this_00;
  WeightParams *pWVar2;
  QuantizationParams *pQVar3;
  LinearQuantizationParams *pLVar4;
  undefined3 in_register_00000089;
  
  pNVar1 = CoreML::Specification::Model::mutable_neuralnetwork(m);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar1->layers_);
  CoreML::Specification::NeuralNetworkLayer::set_name(this,name);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,inTensorAttr->name);
  CoreML::Specification::NeuralNetworkLayer::add_output(this,outTensorAttr->name);
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this);
  this_00->inputchannels_ = 1;
  this_00->outputchannels_ = 1;
  pWVar2 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_00);
  if (CONCAT31(in_register_00000089,areWeightsQuantized) == 0) {
    CoreML::Specification::WeightParams::add_floatvalue(pWVar2,1.0);
  }
  else {
    pQVar3 = CoreML::Specification::WeightParams::mutable_quantization(pWVar2);
    pQVar3->numberofbits_ = 1;
    pLVar4 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar3);
    CoreML::Specification::LinearQuantizationParams::add_scale(pLVar4,1.0);
    CoreML::Specification::LinearQuantizationParams::add_bias(pLVar4,0.0);
    CoreML::Specification::WeightParams::set_int8rawvalue(pWVar2,"x01");
  }
  this_00->hasbias_ = true;
  pWVar2 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_00);
  if (isBiasQuantized) {
    pQVar3 = CoreML::Specification::WeightParams::mutable_quantization(pWVar2);
    pQVar3->numberofbits_ = 1;
    pLVar4 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar3);
    CoreML::Specification::LinearQuantizationParams::add_scale(pLVar4,1.0);
    CoreML::Specification::LinearQuantizationParams::add_bias(pLVar4,0.0);
    CoreML::Specification::WeightParams::set_int8rawvalue(pWVar2,"x01");
  }
  else {
    CoreML::Specification::WeightParams::add_floatvalue(pWVar2,1.0);
  }
  if (isUpdatable) {
    this->isupdatable_ = true;
    pWVar2 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_00);
    pWVar2->isupdatable_ = true;
    pWVar2 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_00);
    pWVar2->isupdatable_ = true;
  }
  return pNVar1;
}

Assistant:

Specification::NeuralNetwork* addInnerProductLayer(Specification::Model& m, bool isUpdatable, const char *name, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, bool areWeightsQuantized, bool isBiasQuantized) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto layer = neuralNet->add_layers();
    
    layer->set_name(name);
    layer->add_input(inTensorAttr->name);
    layer->add_output(outTensorAttr->name);
    Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);

    // set weight
    auto* weights = innerProductParams->mutable_weights();
    if (areWeightsQuantized) {
        auto *quant_params = weights->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        weights->set_int8rawvalue("x01"); // this is [1]
    } else {
        weights->add_floatvalue(1.0);
    }

    // set bias
    innerProductParams->set_hasbias(true);
    auto* bias = innerProductParams->mutable_bias();
    if (isBiasQuantized) {
        auto *quant_params = bias->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        bias->set_int8rawvalue("x01"); // this is [1]
    } else {
        bias->add_floatvalue(1.0);
    }
    
    if (isUpdatable) {
        layer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        innerProductParams->mutable_bias()->set_isupdatable(true);
    }

    return neuralNet;
}